

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

CloudNode * cloudBddAnd(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  CloudCacheEntry2 *pCVar1;
  uint uVar2;
  CloudNode *pCVar3;
  CloudNode *pCVar4;
  CloudNode *pCVar5;
  CloudNode *pCVar6;
  uint uVar7;
  uint uVar8;
  CloudNode *pCVar9;
  
  if (g < f) {
    __assert_fail("f <= g",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                  ,0x15e,"CloudNode *cloudBddAnd(CloudManager *, CloudNode *, CloudNode *)");
  }
  pCVar3 = (CloudNode *)((ulong)f & 0xfffffffffffffffe);
  pCVar6 = (CloudNode *)((ulong)g & 0xfffffffffffffffe);
  if (pCVar3 == pCVar6) {
    if (f == g) {
      return f;
    }
    return dd->zero;
  }
  if (dd->one == pCVar3) {
    if (dd->one != f) {
      return f;
    }
    return g;
  }
  uVar7 = (uint)(((int)f * 0xc00005 + (int)g) * 0x40f1f9) >> ((byte)dd->shiftCache[0] & 0x1f);
  pCVar1 = dd->tCaches[0] + uVar7;
  if (((dd->tCaches[0][uVar7].s == dd->nSignCur) && (pCVar1->a == f)) && (pCVar1->b == g)) {
    pCVar9 = pCVar1->r;
  }
  else {
    pCVar9 = (CloudNode *)0x0;
  }
  if (pCVar9 != (CloudNode *)0x0) {
    dd->nCacheHits = dd->nCacheHits + 1;
    return pCVar9;
  }
  dd->nCacheMisses = dd->nCacheMisses + 1;
  uVar7 = pCVar3->v;
  uVar2 = pCVar6->v;
  pCVar5 = f;
  pCVar9 = f;
  uVar8 = uVar2;
  if (uVar7 <= uVar2) {
    pCVar9 = pCVar3->e;
    uVar8 = uVar7;
    if (((ulong)f & 1) == 0) {
      pCVar5 = pCVar3->t;
    }
    else {
      pCVar9 = (CloudNode *)((ulong)pCVar9 ^ 1);
      pCVar5 = (CloudNode *)((ulong)pCVar3->t ^ 1);
    }
  }
  pCVar4 = g;
  pCVar3 = g;
  if (uVar2 <= uVar7) {
    pCVar3 = pCVar6->e;
    if (((ulong)g & 1) == 0) {
      pCVar4 = pCVar6->t;
    }
    else {
      pCVar3 = (CloudNode *)((ulong)pCVar3 ^ 1);
      pCVar4 = (CloudNode *)((ulong)pCVar6->t ^ 1);
    }
  }
  pCVar6 = pCVar4;
  if (pCVar4 < pCVar5) {
    pCVar6 = pCVar5;
    pCVar5 = pCVar4;
  }
  pCVar6 = cloudBddAnd(dd,pCVar5,pCVar6);
  if (pCVar6 != (CloudNode *)0x0) {
    pCVar5 = pCVar3;
    if (pCVar3 < pCVar9) {
      pCVar5 = pCVar9;
      pCVar9 = pCVar3;
    }
    pCVar3 = cloudBddAnd(dd,pCVar9,pCVar5);
    if (pCVar3 != (CloudNode *)0x0) {
      if (pCVar6 == pCVar3) {
LAB_005ccaa1:
        pCVar1->s = dd->nSignCur;
        pCVar1->a = f;
        pCVar1->b = g;
        pCVar1->r = pCVar6;
        return pCVar6;
      }
      if (((ulong)pCVar6 & 1) == 0) {
        pCVar6 = cloudMakeNode(dd,uVar8,pCVar6,pCVar3);
        if (pCVar6 != (CloudNode *)0x0) goto LAB_005ccaa1;
      }
      else {
        pCVar6 = cloudMakeNode(dd,uVar8,(CloudNode *)((ulong)pCVar6 & 0xfffffffffffffffe),
                               (CloudNode *)((ulong)pCVar3 ^ 1));
        if (pCVar6 != (CloudNode *)0x0) {
          pCVar6 = (CloudNode *)((ulong)pCVar6 ^ 1);
          goto LAB_005ccaa1;
        }
      }
    }
  }
  return (CloudNode *)0x0;
}

Assistant:

CloudNode * cloudBddAnd( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    CloudNode * F, * G, * r;
    CloudCacheEntry2 * cacheEntry;
    CloudNode * fv, * fnv, * gv, * gnv, * t, * e;
    CloudVar  var;

    assert( f <= g );

    // terminal cases
    F = Cloud_Regular(f);
    G = Cloud_Regular(g);
    if ( F == G )
    {
        if ( f == g )
            return f;
        else
            return dd->zero;
    }
    if ( F == dd->one )
    {
        if ( f == dd->one )
            return g;
        else
            return f;
    }

    // check cache
    cacheEntry = dd->tCaches[CLOUD_OPER_AND] + cloudHashCudd2(f, g, dd->shiftCache[CLOUD_OPER_AND]);
//    cacheEntry = dd->tCaches[CLOUD_OPER_AND] + cloudHashBuddy2(f, g, dd->shiftCache[CLOUD_OPER_AND]);
    r = cloudCacheLookup2( cacheEntry, dd->nSignCur, f, g );
    if ( r != NULL )
    {
        dd->nCacheHits++;
        return r;
    }
    dd->nCacheMisses++;


    // compute cofactors
    if ( cloudV(F) <= cloudV(G) )
    {
        var = cloudV(F);
        if ( Cloud_IsComplement(f) )
        {
            fnv = Cloud_Not(cloudE(F));
            fv  = Cloud_Not(cloudT(F));
        }
        else
        {
            fnv = cloudE(F);
            fv  = cloudT(F);
        }
    }
    else
    {
        var = cloudV(G);
        fv  = fnv = f;
    }

    if ( cloudV(G) <= cloudV(F) )
    {
        if ( Cloud_IsComplement(g) )
        {
            gnv = Cloud_Not(cloudE(G));
            gv  = Cloud_Not(cloudT(G));
        }
        else
        {
            gnv = cloudE(G);
            gv  = cloudT(G);
        }
    }
    else
    {
        gv = gnv = g;
    }

    if ( fv <= gv )
        t = cloudBddAnd( dd, fv, gv );
    else
        t = cloudBddAnd( dd, gv, fv );

    if ( t == NULL )
        return NULL;

    if ( fnv <= gnv )
        e = cloudBddAnd( dd, fnv, gnv );
    else
        e = cloudBddAnd( dd, gnv, fnv );

    if ( e == NULL )
        return NULL;

    if ( t == e )
        r = t;
    else
    {
        if ( Cloud_IsComplement(t) )
        {
            r = cloudMakeNode( dd, var, Cloud_Not(t), Cloud_Not(e) );
            if ( r == NULL )
                return NULL;
            r = Cloud_Not(r);
        }
        else
        {
            r = cloudMakeNode( dd, var, t, e );
            if ( r == NULL )
                return NULL;
        }
    }
    cloudCacheInsert2( cacheEntry, dd->nSignCur, f, g, r );
    return r;
}